

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

TestBuilder * __thiscall
anon_unknown.dwarf_af3cfc::TestBuilder::EditPush
          (TestBuilder *this,uint pos,string *hexin,string *hexout)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  const_iterator __last_00;
  string_view hex_str;
  string_view hex_str_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  size_type sVar1;
  const_iterator __position;
  uchar *puVar2;
  uint in_ESI;
  TestBuilder *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dataout;
  vector<unsigned_char,_std::allocator<unsigned_char>_> datain;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  assertion_result *in_stack_fffffffffffffde8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  const_string *in_stack_fffffffffffffe00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  lazy_ostream *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  const_iterator __first_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last_01;
  size_t in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  const_string local_d8;
  lazy_ostream local_c8 [2];
  uchar *local_a0;
  uchar *local_98;
  assertion_result local_70 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->havePush & 1U) == 0) {
    __assert_fail("havePush",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
                  ,0x164,
                  "TestBuilder &(anonymous namespace)::TestBuilder::EditPush(unsigned int, const std::string &, const std::string &)"
                 );
  }
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdf8);
  hex_str._M_str = in_stack_fffffffffffffe48;
  hex_str._M_len = in_stack_fffffffffffffe40;
  ParseHex<unsigned_char>(hex_str);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdf8);
  hex_str_00._M_str = in_stack_fffffffffffffe48;
  hex_str_00._M_len = in_stack_fffffffffffffe40;
  ParseHex<unsigned_char>(hex_str_00);
  __first._M_current = (uchar *)(ulong)in_ESI;
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffdd8);
  __position._M_current = __first._M_current + sVar1;
  puVar2 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffffdd8);
  if (puVar2 < __position._M_current) {
    __assert_fail("pos + datain.size() <= push.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
                  ,0x167,
                  "TestBuilder &(anonymous namespace)::TestBuilder::EditPush(unsigned int, const std::string &, const std::string &)"
                 );
  }
  do {
    __last_01._M_current = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffde8,
               (pointer)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
               (unsigned_long)in_stack_fffffffffffffdd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffe18,
               (const_string *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               (size_t)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    __first_00._M_current = (uchar *)&in_RDI->push;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)in_stack_fffffffffffffde8,
                CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    local_a0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    local_98 = (uchar *)__gnu_cxx::
                        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)in_stack_fffffffffffffde8,
                                    CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdd8);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)in_stack_fffffffffffffde8,
                CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffdd8);
    __last._M_current._7_1_ = in_stack_fffffffffffffe27;
    __last._M_current._0_7_ = in_stack_fffffffffffffe20;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (in_stack_fffffffffffffe08,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__first_00._M_current,__last,(allocator_type *)in_stack_fffffffffffffe00);
    in_stack_fffffffffffffe27 =
         std::operator==(in_stack_fffffffffffffe08,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffe00);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffde8,(bool)in_stack_fffffffffffffde7);
    in_stack_fffffffffffffe18 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffde8,
               (pointer)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
               (unsigned_long)in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffdd8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_70,local_c8,&local_d8,0x168,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffdd8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffdd8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde8);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffdd8)
    ;
    in_stack_fffffffffffffe17 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe17);
  this_01 = &in_RDI->push;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)in_stack_fffffffffffffde8,
            CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffde8,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)in_stack_fffffffffffffde8,
            CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdd8);
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)in_stack_fffffffffffffde8,
            CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffde8,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  __last_00._M_current._7_1_ = in_stack_fffffffffffffe27;
  __last_00._M_current._0_7_ = in_stack_fffffffffffffe20;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase(this_01,__first_00,__last_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)in_stack_fffffffffffffde8,
            CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffde8,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  this_00 = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            (this_01,__position,__first,__last_01);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

TestBuilder& EditPush(unsigned int pos, const std::string& hexin, const std::string& hexout)
    {
        assert(havePush);
        std::vector<unsigned char> datain = ParseHex(hexin);
        std::vector<unsigned char> dataout = ParseHex(hexout);
        assert(pos + datain.size() <= push.size());
        BOOST_CHECK_MESSAGE(std::vector<unsigned char>(push.begin() + pos, push.begin() + pos + datain.size()) == datain, comment);
        push.erase(push.begin() + pos, push.begin() + pos + datain.size());
        push.insert(push.begin() + pos, dataout.begin(), dataout.end());
        return *this;
    }